

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

Expression * __thiscall
wasm::TranslateToFuzzReader::_makeConcrete(TranslateToFuzzReader *this,Type type)

{
  WeightedOption weightedOption;
  WeightedOption weightedOption_00;
  WeightedOption weightedOption_01;
  WeightedOption weightedOption_02;
  WeightedOption rest;
  WeightedOption rest_00;
  WeightedOption rest_01;
  WeightedOption rest_1;
  WeightedOption rest_1_00;
  WeightedOption rest_2;
  WeightedOption rest_2_00;
  bool bVar1;
  FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)> *pFVar2;
  Expression *pEVar3;
  long *plVar4;
  long extraout_RDX;
  code *local_4b8;
  bool local_419;
  FeatureSet local_3fc;
  _Node_iterator_base<std::pair<const_wasm::Type,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_true>
  local_3f8;
  _Node_iterator_base<std::pair<const_wasm::Type,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_true>
  local_3f0;
  code *local_3e8;
  undefined8 local_3e0;
  FeatureSet local_3d4;
  _Node_iterator_base<std::pair<const_wasm::Type,_std::vector<std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>_>,_true>
  local_3d0;
  _Node_iterator_base<std::pair<const_wasm::Type,_std::vector<std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>_>,_true>
  local_3c8;
  code *local_3c0;
  undefined8 local_3b8;
  FeatureSet local_3ac;
  code *local_3a8;
  undefined8 local_3a0;
  FeatureSet local_394;
  code *local_390;
  undefined8 local_388;
  FeatureSet local_380;
  BasicHeapType local_37c;
  code *local_378;
  undefined8 local_370;
  FeatureSet local_368;
  BasicHeapType local_364;
  code *local_360;
  undefined8 local_358;
  FeatureSet local_34c;
  HeapType local_348;
  HeapType heapType;
  FeatureSet local_32c;
  code *local_328;
  undefined8 uStack_320;
  code *local_318;
  undefined8 uStack_310;
  code *local_308;
  undefined8 local_300;
  code *local_2f8;
  undefined8 local_2f0;
  FeatureSet local_2e4;
  code *local_2e0;
  undefined8 uStack_2d8;
  code *local_2d0;
  undefined8 local_2c8;
  code *local_2c0;
  undefined8 local_2b8;
  FeatureSet local_2ac;
  code *local_2a8;
  undefined8 local_2a0;
  FeatureSet local_294;
  code *local_290;
  undefined8 local_288;
  FeatureSet local_27c;
  code *local_278;
  undefined8 local_270;
  FeatureSet local_268;
  BasicType local_264;
  code *local_260;
  undefined8 local_258;
  FeatureSet local_24c;
  code *local_248;
  undefined8 local_240;
  FeatureSet local_234;
  code *local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  FeatureSet local_214;
  code *local_210;
  undefined8 local_208;
  FeatureSet local_1fc;
  code *local_1f8;
  undefined8 local_1f0;
  code *local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  code *local_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  FeatureSet local_1b4;
  code *local_1b0;
  undefined8 local_1a8;
  FeatureSet local_19c;
  code *local_198;
  undefined8 local_190;
  FeatureSet local_184;
  code *local_180;
  undefined8 local_178;
  FeatureSet local_16c;
  code *local_168;
  undefined8 local_160;
  FeatureSet local_154;
  code *local_150;
  undefined8 local_148;
  code *local_140;
  undefined8 local_138;
  code *local_130;
  undefined8 uStack_128;
  undefined8 local_120;
  code *local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  code *local_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  code *local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  FeatureSet local_cc;
  code *local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  code *local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  code *local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  code *local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  FeatureSet local_54;
  undefined1 local_50 [8];
  FeatureOptions<Expression_*(Self::*)(Type)> options;
  bool canMakeControlFlow;
  TranslateToFuzzReader *this_local;
  Type type_local;
  
  this_local = (TranslateToFuzzReader *)type.id;
  bVar1 = Type::isTuple((Type *)&this_local);
  local_419 = true;
  if (bVar1) {
    local_419 = FeatureSet::hasMultivalue(&this->wasm->features);
  }
  options.options._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = local_419;
  Random::FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::
  FeatureOptions((FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)> *)
                 local_50);
  FeatureSet::FeatureSet(&local_54,0);
  local_80 = makeLocalGet;
  uStack_78 = 0;
  local_70 = 4;
  local_98 = makeLocalSet;
  uStack_90 = 0;
  local_88 = 4;
  local_b0 = makeGlobalGet;
  uStack_a8 = 0;
  local_a0 = 2;
  local_c8 = makeConst;
  uStack_c0 = 0;
  local_b8 = 2;
  weightedOption.weight = 4;
  weightedOption._0_16_ = ZEXT816(0x20ca10);
  rest.weight = 4;
  rest._0_16_ = ZEXT816(0x20cc00);
  rest_1.weight = 2;
  rest_1._0_16_ = ZEXT816(0x20e7a0);
  rest_2.weight = 2;
  rest_2._0_16_ = ZEXT816(0x206430);
  Random::FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::
  add<wasm::Random::FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::WeightedOption,wasm::Random::FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::WeightedOption,wasm::Random::FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::WeightedOption>
            ((FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)> *)
             local_50,local_54,weightedOption,rest,rest_1,rest_2);
  if ((options.options._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ & 1) != 0) {
    FeatureSet::FeatureSet(&local_cc,0);
    local_e8 = makeBlock;
    uStack_e0 = 0;
    local_d8 = 2;
    local_100 = makeIf;
    uStack_f8 = 0;
    local_f0 = 2;
    local_118 = makeLoop;
    uStack_110 = 0;
    local_108 = 2;
    local_130 = makeBreak;
    uStack_128 = 0;
    local_120 = 2;
    local_140 = makeCall;
    local_138 = 0;
    local_150 = makeCallIndirect;
    local_148 = 0;
    weightedOption_00.weight = 2;
    weightedOption_00._0_16_ = ZEXT816(0x20b430);
    rest_00.weight = 2;
    rest_00._0_16_ = ZEXT816(0x20e940);
    rest_1_00.weight = 2;
    rest_1_00._0_16_ = ZEXT816(0x20eb30);
    rest_2_00.weight = 2;
    rest_2_00._0_16_ = ZEXT816(0x20ee20);
    pFVar2 = Random::FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::
             add<wasm::Random::FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::WeightedOption,wasm::Random::FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::WeightedOption,wasm::Random::FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::WeightedOption,wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type),wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>
                       ((FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>
                         *)local_50,local_cc,weightedOption_00,rest_00,rest_1_00,rest_2_00,0x20f2f0,
                        0);
    FeatureSet::FeatureSet(&local_154,0x40);
    local_168 = makeTry;
    local_160 = 0;
    pFVar2 = Random::FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>
             ::add<>(pFVar2,local_154,0x20fc10);
    FeatureSet::FeatureSet(&local_16c,0x40);
    local_180 = makeTryTable;
    local_178 = 0;
    pFVar2 = Random::FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>
             ::add<>(pFVar2,local_16c,0x210120);
    FeatureSet::FeatureSet(&local_184,0x500);
    local_198 = makeCallRef;
    local_190 = 0;
    pFVar2 = Random::FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>
             ::add<>(pFVar2,local_184,0x210870);
    FeatureSet::FeatureSet(&local_19c,0x500);
    local_1b0 = makeBrOn;
    local_1a8 = 0;
    Random::FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::add<>
              (pFVar2,local_19c,0x210c30);
  }
  bVar1 = Type::isSingle((Type *)&this_local);
  if (bVar1) {
    FeatureSet::FeatureSet(&local_1b4,0);
    local_1d0 = makeUnary;
    uStack_1c8 = 0;
    local_1c0 = 2;
    local_1e8 = makeBinary;
    uStack_1e0 = 0;
    local_1d8 = 2;
    local_1f8 = makeSelect;
    local_1f0 = 0;
    weightedOption_01.weight = 2;
    weightedOption_01._0_16_ = ZEXT816(0x211290);
    rest_01.weight = 2;
    rest_01._0_16_ = ZEXT816(0x212770);
    pFVar2 = Random::FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::
             add<wasm::Random::FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::WeightedOption,wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>
                       ((FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>
                         *)local_50,local_1b4,weightedOption_01,rest_01,0x2134f0);
    FeatureSet::FeatureSet(&local_1fc,0x200);
    local_210 = makeTupleExtract;
    local_208 = 0;
    Random::FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::add<>
              (pFVar2,local_1fc,0x2135a0);
  }
  bVar1 = Type::isSingle((Type *)&this_local);
  if ((bVar1) && (bVar1 = Type::isRef((Type *)&this_local), !bVar1)) {
    FeatureSet::FeatureSet(&local_214,0);
    local_230 = makeLoad;
    uStack_228 = 0;
    local_220 = 2;
    weightedOption_02.weight = 2;
    weightedOption_02._0_16_ = ZEXT816(0x213a00);
    Random::FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::add<>
              ((FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)> *)
               local_50,local_214,weightedOption_02);
    FeatureSet::FeatureSet(&local_234,8);
    local_248 = makeSIMD;
    local_240 = 0;
    Random::FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::add<>
              ((FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)> *)
               local_50,local_234,0x213b60);
  }
  bVar1 = Type::isInteger((Type *)&this_local);
  if (bVar1) {
    FeatureSet::FeatureSet(&local_24c,1);
    local_260 = makeAtomic;
    local_258 = 0;
    Random::FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::add<>
              ((FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)> *)
               local_50,local_24c,0x213d00);
  }
  local_264 = i32;
  bVar1 = Type::operator==((Type *)&this_local,&local_264);
  if (bVar1) {
    bVar1 = IString::operator_cast_to_bool(&(this->callExportCatchImportName).super_IString);
    if ((bVar1) ||
       (bVar1 = IString::operator_cast_to_bool(&(this->callRefCatchImportName).super_IString), bVar1
       )) {
      FeatureSet::FeatureSet(&local_268,0);
      local_278 = makeImportCallCode;
      local_270 = 0;
      Random::FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::add<>
                ((FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)> *)
                 local_50,local_268,0x209110);
    }
    bVar1 = IString::operator_cast_to_bool(&(this->sleepImportName).super_IString);
    if (bVar1) {
      FeatureSet::FeatureSet(&local_27c,0);
      local_290 = makeImportSleep;
      local_288 = 0;
      Random::FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::add<>
                ((FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)> *)
                 local_50,local_27c,0x2096f0);
    }
    FeatureSet::FeatureSet(&local_294,0x100);
    local_2a8 = makeRefIsNull;
    local_2a0 = 0;
    Random::FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::add<>
              ((FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)> *)
               local_50,local_294,0x214340);
    FeatureSet::FeatureSet(&local_2ac,0x500);
    local_2c0 = makeRefEq;
    local_2b8 = 0;
    local_2d0 = makeRefTest;
    local_2c8 = 0;
    local_2e0 = makeI31Get;
    uStack_2d8 = 0;
    Random::FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::
    add<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type),wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>
              ((FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)> *)
               local_50,local_2ac,0x214410,0,0x214520);
    FeatureSet::FeatureSet(&local_2e4,0x4500);
    local_2f8 = makeStringEncode;
    local_2f0 = 0;
    local_308 = makeStringEq;
    local_300 = 0;
    local_318 = makeStringMeasure;
    uStack_310 = 0;
    local_328 = makeStringGet;
    uStack_320 = 0;
    Random::FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::
    add<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type),wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type),wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>
              ((FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)> *)
               local_50,local_2e4,0x2148b0,0,0x214c10,0);
  }
  bVar1 = Type::isTuple((Type *)&this_local);
  if (bVar1) {
    FeatureSet::FeatureSet(&local_32c,0x200);
    heapType.id = (uintptr_t)makeTupleMake;
    Random::FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::add<>
              ((FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)> *)
               local_50,local_32c,0x214ec0);
  }
  bVar1 = Type::isRef((Type *)&this_local);
  if (bVar1) {
    local_348 = Type::getHeapType((Type *)&this_local);
    bVar1 = HeapType::isBasic(&local_348);
    if (bVar1) {
      FeatureSet::FeatureSet(&local_34c,0x500);
      local_360 = makeBasicRef;
      local_358 = 0;
      Random::FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::add<>
                ((FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)> *)
                 local_50,local_34c,0x208170);
      bVar1 = Type::isNullable((Type *)&this_local);
      if ((bVar1) && (this->funcContext != (FunctionCreationContext *)0x0)) {
        local_364 = func;
        bVar1 = HeapType::operator==(&local_348,&local_364);
        if (bVar1) {
          FeatureSet::FeatureSet(&local_368,0x100);
          local_378 = makeTableGet;
          local_370 = 0;
          Random::FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::
          add<>((FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)> *)
                local_50,local_368,0x2150a0);
        }
        local_37c = exn;
        bVar1 = HeapType::operator==(&local_348,&local_37c);
        if (bVar1) {
          FeatureSet::FeatureSet(&local_380,0x40);
          local_390 = makeTableGet;
          local_388 = 0;
          Random::FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::
          add<>((FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)> *)
                local_50,local_380,0x2150a0);
        }
      }
    }
    else {
      FeatureSet::FeatureSet(&local_394,0x500);
      local_3a8 = makeCompoundRef;
      local_3a0 = 0;
      Random::FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::add<>
                ((FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)> *)
                 local_50,local_394,0x215190);
    }
    FeatureSet::FeatureSet(&local_3ac,0x500);
    local_3c0 = makeRefCast;
    local_3b8 = 0;
    Random::FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::add<>
              ((FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)> *)
               local_50,local_3ac,0x2158d0);
  }
  bVar1 = FeatureSet::hasGC(&this->wasm->features);
  if (bVar1) {
    local_3c8._M_cur =
         (__node_type *)
         std::
         unordered_map<wasm::Type,_std::vector<std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<std::pair<const_wasm::Type,_std::vector<std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>_>_>_>
         ::find(&this->typeStructFields,(key_type *)&this_local);
    local_3d0._M_cur =
         (__node_type *)
         std::
         unordered_map<wasm::Type,_std::vector<std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<std::pair<const_wasm::Type,_std::vector<std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>_>_>_>
         ::end(&this->typeStructFields);
    bVar1 = std::__detail::operator!=(&local_3c8,&local_3d0);
    if (bVar1) {
      FeatureSet::FeatureSet(&local_3d4,0x500);
      local_3e8 = makeStructGet;
      local_3e0 = 0;
      Random::FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::add<>
                ((FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)> *)
                 local_50,local_3d4,0x215ab0);
    }
    local_3f0._M_cur =
         (__node_type *)
         std::
         unordered_map<wasm::Type,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<std::pair<const_wasm::Type,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
         ::find(&this->typeArrays,(key_type *)&this_local);
    local_3f8._M_cur =
         (__node_type *)
         std::
         unordered_map<wasm::Type,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<std::pair<const_wasm::Type,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
         ::end(&this->typeArrays);
    bVar1 = std::__detail::operator!=(&local_3f0,&local_3f8);
    if (bVar1) {
      FeatureSet::FeatureSet(&local_3fc,0x500);
      Random::FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::add<>
                ((FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)> *)
                 local_50,local_3fc,0x215bc0);
    }
  }
  local_4b8 = (code *)_wasm__TranslateToFuzzReader___constwasm__TranslateToFuzzReader__pick<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>_wasm__Random__FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>___
                                (this,(FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>
                                       *)local_50);
  plVar4 = (long *)((long)&this->wasm + extraout_RDX);
  if (((ulong)local_4b8 & 1) != 0) {
    local_4b8 = *(code **)(local_4b8 + *plVar4 + -1);
  }
  pEVar3 = (Expression *)(*local_4b8)(plVar4,this_local);
  Random::FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::
  ~FeatureOptions((FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)> *)
                  local_50);
  return pEVar3;
}

Assistant:

Expression* TranslateToFuzzReader::_makeConcrete(Type type) {
  bool canMakeControlFlow = !type.isTuple() || wasm.features.hasMultivalue();
  using Self = TranslateToFuzzReader;
  FeatureOptions<Expression* (Self::*)(Type)> options;
  using WeightedOption = decltype(options)::WeightedOption;
  options.add(FeatureSet::MVP,
              WeightedOption{&Self::makeLocalGet, VeryImportant},
              WeightedOption{&Self::makeLocalSet, VeryImportant},
              WeightedOption{&Self::makeGlobalGet, Important},
              WeightedOption{&Self::makeConst, Important});
  if (canMakeControlFlow) {
    options
      .add(FeatureSet::MVP,
           WeightedOption{&Self::makeBlock, Important},
           WeightedOption{&Self::makeIf, Important},
           WeightedOption{&Self::makeLoop, Important},
           WeightedOption{&Self::makeBreak, Important},
           &Self::makeCall,
           &Self::makeCallIndirect)
      .add(FeatureSet::ExceptionHandling, &Self::makeTry)
      .add(FeatureSet::ExceptionHandling, &Self::makeTryTable)
      .add(FeatureSet::ReferenceTypes | FeatureSet::GC, &Self::makeCallRef)
      .add(FeatureSet::ReferenceTypes | FeatureSet::GC, &Self::makeBrOn);
  }
  if (type.isSingle()) {
    options
      .add(FeatureSet::MVP,
           WeightedOption{&Self::makeUnary, Important},
           WeightedOption{&Self::makeBinary, Important},
           &Self::makeSelect)
      .add(FeatureSet::Multivalue, &Self::makeTupleExtract);
  }
  if (type.isSingle() && !type.isRef()) {
    options.add(FeatureSet::MVP, {&Self::makeLoad, Important});
    options.add(FeatureSet::SIMD, &Self::makeSIMD);
  }
  if (type.isInteger()) {
    options.add(FeatureSet::Atomics, &Self::makeAtomic);
  }
  if (type == Type::i32) {
    if (callExportCatchImportName || callRefCatchImportName) {
      options.add(FeatureSet::MVP, &Self::makeImportCallCode);
    }
    if (sleepImportName) {
      options.add(FeatureSet::MVP, &Self::makeImportSleep);
    }
    options.add(FeatureSet::ReferenceTypes, &Self::makeRefIsNull);
    options.add(FeatureSet::ReferenceTypes | FeatureSet::GC,
                &Self::makeRefEq,
                &Self::makeRefTest,
                &Self::makeI31Get);
    options.add(FeatureSet::ReferenceTypes | FeatureSet::GC |
                  FeatureSet::Strings,
                &Self::makeStringEncode,
                &Self::makeStringEq,
                &Self::makeStringMeasure,
                &Self::makeStringGet);
  }
  if (type.isTuple()) {
    options.add(FeatureSet::Multivalue, &Self::makeTupleMake);
  }
  if (type.isRef()) {
    auto heapType = type.getHeapType();
    if (heapType.isBasic()) {
      options.add(FeatureSet::ReferenceTypes | FeatureSet::GC,
                  &Self::makeBasicRef);
      if (type.isNullable() && funcContext) {
        if (heapType == HeapType::func) {
          options.add(FeatureSet::ReferenceTypes, &Self::makeTableGet);
        }
        if (heapType == HeapType::exn) {
          options.add(FeatureSet::ExceptionHandling, &Self::makeTableGet);
        }
      }
    } else {
      options.add(FeatureSet::ReferenceTypes | FeatureSet::GC,
                  &Self::makeCompoundRef);
    }
    options.add(FeatureSet::ReferenceTypes | FeatureSet::GC,
                &Self::makeRefCast);
  }
  if (wasm.features.hasGC()) {
    if (typeStructFields.find(type) != typeStructFields.end()) {
      options.add(FeatureSet::ReferenceTypes | FeatureSet::GC,
                  &Self::makeStructGet);
    }
    if (typeArrays.find(type) != typeArrays.end()) {
      options.add(FeatureSet::ReferenceTypes | FeatureSet::GC,
                  &Self::makeArrayGet);
    }
  }
  return (this->*pick(options))(type);
}